

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void container_printf(container_t *c,uint8_t type)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  undefined7 in_register_00000031;
  char *__format;
  uint uVar5;
  long lVar6;
  
  uVar5 = (uint)CONCAT71(in_register_00000031,type);
  if (uVar5 == 4) {
    uVar5 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar5 != '\x03') {
    if ((uVar5 & 0xff) == 2) {
      array_container_printf((array_container_t *)c);
      return;
    }
    putchar(0x7b);
    bVar4 = true;
    uVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x400; lVar6 = lVar6 + 1) {
      for (uVar3 = *(ulong *)(((array_container_t *)c)->array + lVar6 * 4); uVar3 != 0;
          uVar3 = uVar3 & uVar3 - 1) {
        lVar2 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        __format = ",%u";
        if (bVar4) {
          __format = "%u";
        }
        bVar4 = false;
        printf(__format,(ulong)((uint)lVar2 | uVar5));
      }
      uVar5 = uVar5 + 0x40;
    }
    putchar(0x7d);
    return;
  }
  for (lVar6 = 0; lVar6 < ((array_container_t *)c)->cardinality; lVar6 = lVar6 + 1) {
    uVar1 = ((array_container_t *)c)->array[lVar6 * 2];
    printf("[%d,%d]",(ulong)uVar1,
           (ulong)((uint)((array_container_t *)c)->array[lVar6 * 2 + 1] + (uint)uVar1));
  }
  return;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}